

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

void huge_repeat_cb(uv_timer_t *handle)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_timer_t uStack_a8;
  
  if (huge_repeat_cb::ncalls == 0) {
    if (handle == &huge_timer1) {
      huge_repeat_cb::ncalls = 1;
      return;
    }
  }
  else {
    if (handle == &tiny_timer) {
      huge_repeat_cb::ncalls = huge_repeat_cb::ncalls + 1;
      if (huge_repeat_cb::ncalls != 10) {
        return;
      }
      uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
      uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
      return;
    }
    huge_repeat_cb_cold_1();
  }
  huge_repeat_cb_cold_2();
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&uStack_a8);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&uStack_a8,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_001830cd;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001830d2;
    if (timer_run_once_timer_cb_called != 1) goto LAB_001830d7;
    iVar1 = uv_timer_start(&uStack_a8,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_001830dc;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001830e1;
    if (timer_run_once_timer_cb_called != 2) goto LAB_001830e6;
    uv_close((uv_handle_t *)&uStack_a8,(uv_close_cb)0x0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001830f0;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_001830cd:
    run_test_timer_run_once_cold_2();
LAB_001830d2:
    run_test_timer_run_once_cold_3();
LAB_001830d7:
    run_test_timer_run_once_cold_4();
LAB_001830dc:
    run_test_timer_run_once_cold_5();
LAB_001830e1:
    run_test_timer_run_once_cold_6();
LAB_001830e6:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_001830f0:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return;
}

Assistant:

static void huge_repeat_cb(uv_timer_t* handle) {
  static int ncalls;

  if (ncalls == 0)
    ASSERT(handle == &huge_timer1);
  else
    ASSERT(handle == &tiny_timer);

  if (++ncalls == 10) {
    uv_close((uv_handle_t*) &tiny_timer, NULL);
    uv_close((uv_handle_t*) &huge_timer1, NULL);
  }
}